

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  rnnvalue **pprVar1;
  rnnvalue *prVar2;
  rnnbitfield **pprVar3;
  rnnbitfield *prVar4;
  uint uVar5;
  int iVar6;
  rnnvalue ***ppprVar7;
  rnnbitfield ***ppprVar8;
  char *pcVar9;
  rnndeccolors *prVar10;
  long lVar11;
  double dVar12;
  char *pcVar13;
  ulong value_00;
  char **__ptr;
  ulong uVar14;
  char *__fmt;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  char *res;
  ulong local_48;
  char *tmp;
  ulong local_38;
  
code_r0x0010772a:
  uVar19 = value >> 0x20;
  res = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar6 = ti->shr;
    uVar17 = value << ((byte)iVar6 & 0x3f);
    uVar14 = uVar17;
    if (iVar6 == 0) {
      uVar14 = value;
    }
    value = uVar14 & 0xffffffff;
    if (iVar6 != 0) {
      uVar19 = uVar17 >> 0x20;
    }
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar7 = &ti->vals;
      piVar15 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar8 = &ti->bitfields;
      piVar15 = &ti->bitfieldsnum;
      goto LAB_001078fa;
    case RNN_TTYPE_ENUM:
      ppprVar7 = &ti->eenum->vals;
      piVar15 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar8 = &ti->ebitset->bitfields;
      piVar15 = &ti->ebitset->bitfieldsnum;
LAB_001078fa:
      pprVar3 = *ppprVar8;
      uVar19 = value | uVar19 << 0x20;
      uVar5 = *piVar15;
      if (*piVar15 < 1) {
        uVar5 = 0;
      }
      uVar17 = (ulong)uVar5;
      uVar18 = 0;
      uVar14 = 0;
      local_38 = uVar17;
      goto LAB_0010791d;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_0010778b_caseD_4;
    case RNN_TTYPE_HEX:
      prVar10 = ctx->colors;
      pcVar13 = (char *)(value | uVar19 << 0x20);
      pcVar16 = prVar10->cimm;
      goto LAB_0010789c;
    case RNN_TTYPE_INT:
      uVar19 = value | uVar19 << 0x20;
      prVar10 = ctx->colors;
      if ((uVar19 >> ((ulong)(byte)((byte)width - 1) & 0x3f) & 1) == 0) {
        pcVar9 = prVar10->cend;
        pcVar16 = "%s%li%s";
      }
      else {
        uVar19 = (1L << ((byte)width & 0x3f)) - uVar19;
        pcVar9 = prVar10->cend;
        pcVar16 = "%s-%li%s";
      }
      asprintf(&res,pcVar16,prVar10->cimm,uVar19,pcVar9);
      return res;
    case RNN_TTYPE_UINT:
      pcVar13 = (char *)(value | uVar19 << 0x20);
      pcVar16 = ctx->colors->cimm;
      pcVar9 = ctx->colors->cend;
      __fmt = "%s%lu%s";
      goto LAB_001078a7;
    case RNN_TTYPE_FLOAT:
switchD_0010778b_caseD_8:
      if (width == 0x20) {
        prVar10 = ctx->colors;
        dVar12 = (double)(float)uVar14;
      }
      else {
        if (width != 0x40) goto switchD_0010778b_default;
        prVar10 = ctx->colors;
        dVar12 = (double)(value | uVar19 << 0x20);
      }
      asprintf(&res,"%s%f%s",dVar12,prVar10->cimm,prVar10->cend);
      return res;
    case RNN_TTYPE_BOOLEAN:
      lVar11 = value + (uVar19 << 0x20);
      if (lVar11 == 1) {
        pcVar9 = ctx->colors->cbool;
        pcVar16 = ctx->colors->cend;
        pcVar13 = "%sTRUE%s";
      }
      else {
        if (lVar11 != 0) goto switchD_0010778b_caseD_8;
        pcVar9 = ctx->colors->cbool;
        pcVar16 = ctx->colors->cend;
        pcVar13 = "%sFALSE%s";
      }
      __ptr = &res;
      asprintf(__ptr,pcVar13,pcVar9,pcVar16);
      goto LAB_001078b6;
    default:
      goto switchD_0010778b_default;
    }
    pprVar1 = *ppprVar7;
    local_48 = value + (uVar19 << 0x20);
    uVar17 = 0;
    uVar14 = (ulong)(uint)*piVar15;
    if (*piVar15 < 1) {
      uVar14 = uVar17;
    }
    goto LAB_0010784f;
  }
  goto switchD_0010778b_default;
switchD_0010778b_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = value | uVar19 << 0x20;
  goto code_r0x0010772a;
LAB_0010791d:
  if (uVar17 == uVar18) goto LAB_00107a80;
  iVar6 = rnndec_varmatch(ctx,&pprVar3[uVar18]->varinfo);
  if (iVar6 != 0) {
    prVar4 = pprVar3[uVar18];
    value_00 = (prVar4->mask & uVar19) >> ((byte)prVar4->low & 0x3f);
    uVar14 = uVar14 | prVar4->mask;
    if ((prVar4->typeinfo).type == RNN_TTYPE_BOOLEAN) {
      if (value_00 != 0) {
        if (value_00 != 1) goto LAB_001079b5;
        if (res == (char *)0x0) {
          asprintf(&res,"%s%s%s",ctx->colors->cbool,prVar4->name,ctx->colors->cend);
        }
        else {
          asprintf(&tmp,"%s | %s%s%s");
          free(res);
          res = tmp;
        }
      }
    }
    else {
LAB_001079b5:
      local_48 = uVar14;
      pcVar9 = rnndec_decodeval(ctx,&prVar4->typeinfo,value_00,(prVar4->high - prVar4->low) + 1);
      if (res == (char *)0x0) {
        asprintf(&res,"%s%s%s = %s",ctx->colors->cname,pprVar3[uVar18]->name,ctx->colors->cend,
                 pcVar9);
      }
      else {
        asprintf(&tmp,"%s | %s%s%s = %s");
        free(res);
        res = tmp;
      }
      free(pcVar9);
      uVar14 = local_48;
      uVar17 = local_38;
    }
  }
  uVar18 = uVar18 + 1;
  goto LAB_0010791d;
LAB_00107a80:
  uVar19 = uVar19 & ~uVar14;
  if (uVar19 != 0) {
    if (res == (char *)0x0) {
      asprintf(&res,"%s%#lx%s",ctx->colors->cerr,uVar19,ctx->colors->cend);
    }
    else {
      asprintf(&tmp,"%s | %s%#lx%s");
      free(res);
      res = tmp;
    }
  }
  if (res == (char *)0x0) {
    asprintf(&res,"%s0%s",ctx->colors->cimm,ctx->colors->cend);
  }
  __ptr = &tmp;
  asprintf(__ptr,"{ %s }",res);
  free(res);
  goto LAB_001078b6;
LAB_0010784f:
  if (uVar14 == uVar17) goto switchD_0010778b_default;
  iVar6 = rnndec_varmatch(ctx,&pprVar1[uVar17]->varinfo);
  if (((iVar6 != 0) && (prVar2 = pprVar1[uVar17], prVar2->valvalid != 0)) &&
     (prVar2->value == local_48)) {
    pcVar13 = prVar2->name;
    pcVar16 = ctx->colors->ceval;
    pcVar9 = ctx->colors->cend;
    __fmt = "%s%s%s";
    goto LAB_001078a7;
  }
  uVar17 = uVar17 + 1;
  goto LAB_0010784f;
switchD_0010778b_default:
  prVar10 = ctx->colors;
  pcVar13 = (char *)(value & 0xffffffff | uVar19 << 0x20);
  pcVar16 = prVar10->cerr;
LAB_0010789c:
  pcVar9 = prVar10->cend;
  __fmt = "%s%#lx%s";
LAB_001078a7:
  __ptr = &res;
  asprintf(__ptr,__fmt,pcVar16,pcVar13,pcVar9);
LAB_001078b6:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->ceval, vals[i]->name, ctx->colors->cend);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->cbool, bitfields[i]->name, ctx->colors->cend);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->cname, bitfields[i]->name, ctx->colors->cend, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value & ~mask, ctx->colors->cend);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->cerr, value & ~mask, ctx->colors->cend);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->cimm, ctx->colors->cend);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->cimm, (UINT64_C(1) << width) - value, ctx->colors->cend);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->cimm, value, ctx->colors->cend);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->cbool, ctx->colors->cend);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.d, ctx->colors->cend);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->cimm,
					val.f, ctx->colors->cend);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->cerr, value, ctx->colors->cend);
			return res;
			break;
	}
}